

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O3

void __thiscall logfault::Handler::PrintMessage(Handler *this,ostream *out,Message *msg)

{
  long lVar1;
  undefined1 auVar2 [16];
  tm *ptVar3;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  string *psVar6;
  pthread_t pVar7;
  long lVar8;
  _Put_time<char> __f;
  _Put_time<char> __f_00;
  time_t tt;
  char local_3b [3];
  long local_38;
  
  lVar1 = (msg->when_).__d.__r;
  local_38 = lVar1 / 1000000000;
  lVar8 = local_38 * 1000000000;
  if (SBORROW8(lVar1,lVar8) != lVar1 % 1000000000 < 0) {
    local_38 = local_38 + -1;
    lVar8 = lVar8 + -1000000000;
  }
  ptVar3 = localtime(&local_38);
  if (ptVar3 == (tm *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"0000-00-00 00:00:00.000",0x17);
  }
  else {
    auVar2 = SEXT816((msg->when_).__d.__r - lVar8) * SEXT816(0x431bde82d7b634db);
    __f._M_fmt = "%Y-%m-%d %H:%M:%S.";
    __f._M_tmb = (tm *)ptVar3;
    this_00 = std::operator<<(out,__f);
    lVar1 = *(long *)this_00;
    *(undefined8 *)(this_00 + *(long *)(lVar1 + -0x18) + 0x10) = 3;
    lVar1 = *(long *)(lVar1 + -0x18);
    pbVar4 = this_00 + lVar1;
    if (this_00[lVar1 + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x0) {
      std::ios::widen((char)pbVar4);
      pbVar4[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
    }
    pbVar4[0xe0] = (basic_ostream<char,_std::char_traits<char>_>)0x30;
    pbVar4 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<
                       ((ostream *)this_00,(int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f));
    __f_00._M_fmt = " %Z";
    __f_00._M_tmb = (tm *)ptVar3;
    std::operator<<(pbVar4,__f_00);
  }
  local_3b[0] = ' ';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,local_3b,1);
  psVar6 = LevelName_abi_cxx11_(msg->level_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  local_3b[1] = 0x20;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3b + 1,1);
  pVar7 = pthread_self();
  if (pVar7 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"thread::id of a non-executing thread",0x24);
  }
  else {
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  local_3b[2] = 0x20;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3b + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,(msg->msg_)._M_dataplus._M_p,(msg->msg_)._M_string_length);
  return;
}

Assistant:

void PrintMessage(std::ostream& out, const logfault::Message& msg) {
            auto tt = std::chrono::system_clock::to_time_t(msg.when_);
            auto when_rounded = std::chrono::system_clock::from_time_t(tt);
            if (when_rounded > msg.when_) {
                --tt;
                when_rounded -= std::chrono::seconds(1);
            }
            if (const auto tm = (LOGFAULT_USE_UTCZONE ? std::gmtime(&tt) : std::localtime(&tt))) {
                const int ms = std::chrono::duration_cast<std::chrono::duration<int, std::milli>>(msg.when_ - when_rounded).count();

                out << std::put_time(tm, LOGFAULT_TIME_FORMAT)
#if LOGFAULT_TIME_PRINT_MILLISECONDS
                    << std::setw(3) << std::setfill('0') << ms
#endif
#if LOGFAULT_TIME_PRINT_TIMEZONE
#   if LOGFAULT_USE_UTCZONE
                    << " UTC";
#   else
                    << std::put_time(tm, " %Z")
#   endif
#endif
                    ;
            } else {
                out << "0000-00-00 00:00:00.000";
            }

            out << ' ' << LevelName(msg.level_)
                << ' ' << LOGFAULT_THREAD_NAME
                << ' ' << msg.msg_;
        }